

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

IO __thiscall adios2::ADIOS::DeclareIO(ADIOS *this,string *name,ArrayOrdering ArrayOrder)

{
  element_type *peVar1;
  IO *io;
  IO local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"for io name ",name);
  std::operator+(&local_80,&local_40,", in call to ADIOS::DeclareIO");
  CheckPointer(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  peVar1 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string(local_60,(string *)name);
  io = (IO *)adios2::core::ADIOS::DeclareIO(peVar1,local_60,ArrayOrder);
  IO::IO(&local_88,io);
  std::__cxx11::string::~string(local_60);
  return (IO)local_88.m_IO;
}

Assistant:

IO ADIOS::DeclareIO(const std::string name, const ArrayOrdering ArrayOrder)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::DeclareIO");
    return IO(&m_ADIOS->DeclareIO(name, ArrayOrder));
}